

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_algorithm.cpp
# Opt level: O2

void try_list_remove(void)

{
  list<int,_std::allocator<int>_> lb;
  list<int,_std::allocator<int>_> la;
  int arr [10];
  list<int,_std::allocator<int>_> local_68;
  list<int,std::allocator<int>> local_50 [24];
  int local_38 [12];
  
  local_38[4] = 9;
  local_38[5] = 8;
  local_38[6] = 6;
  local_38[7] = 4;
  local_38[0] = 1;
  local_38[1] = 3;
  local_38[2] = 5;
  local_38[3] = 7;
  local_38[8] = 2;
  local_38[9] = 0;
  std::__cxx11::list<int,std::allocator<int>>::list<int*,void>
            (local_50,local_38,local_38 + 10,(allocator_type *)&local_68);
  std::__cxx11::list<int,_std::allocator<int>_>::list
            (&local_68,(list<int,_std::allocator<int>_> *)local_50);
  std::operator<<((ostream *)&std::cout,"Original list:\nla:\t");
}

Assistant:

void try_list_remove()  {
    using namespace std;

    const int LIMIT = 10;
    int arr[LIMIT] = {1, 3, 5, 7, 9, 8, 6, 4, 2, 0};
    list<int> la(arr, arr + LIMIT);
    list<int> lb(la);

    cout << "Original list:\nla:\t";
    for_each(la.begin(), la.end(), showInt);
    cout << endl;

    //  member function will adjust size automatically
    la.remove(4);
    cout << "After remove through member function remove():\n";
    cout << "la:\t";
    for_each(la.begin(), la.end(), showInt);
    cout << endl << endl;

    list<int>::iterator last;
    //  STL remove won't adjust size
    //  FIXME: seems remove 0 not working?
    last = remove(lb.begin(), lb.end(), 1);
    cout << "After remove through STL function remove():\n";
    cout << "lb:\t";
    for_each(lb.begin(), lb.end(), showInt);
    cout << endl << endl;

    //  delete a range
    lb.erase(last, lb.end());
    cout << "After erase:\n";
    cout << "lb:\t";
    for_each(lb.begin(), lb.end(), showInt);
    cout << endl << endl;
}